

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O0

RK_U8 find_matching_ltrp(H265eSlice *slice,RK_U32 *ltrpsIndex,RK_S32 ltrpPOC,RK_U32 usedFlag)

{
  uint local_30;
  RK_U32 k;
  RK_U32 lsb;
  RK_U32 usedFlag_local;
  RK_S32 ltrpPOC_local;
  RK_U32 *ltrpsIndex_local;
  H265eSlice *slice_local;
  
  local_30 = 0;
  while( true ) {
    if (slice->m_sps->m_numLongTermRefPicSPS <= local_30) {
      return '\0';
    }
    if ((ltrpPOC % (1 << ((byte)slice->m_sps->m_bitsForPOC & 0x1f)) ==
         slice->m_sps->m_ltRefPicPocLsbSps[local_30]) &&
       (usedFlag == slice->m_sps->m_usedByCurrPicLtSPSFlag[local_30])) break;
    local_30 = local_30 + 1;
  }
  *ltrpsIndex = local_30;
  return '\x01';
}

Assistant:

RK_U8 find_matching_ltrp(H265eSlice* slice, RK_U32 *ltrpsIndex, RK_S32 ltrpPOC, RK_U32 usedFlag)
{
    RK_U32 lsb = ltrpPOC % (1 << slice->m_sps->m_bitsForPOC);
    RK_U32 k;
    for (k = 0; k < slice->m_sps->m_numLongTermRefPicSPS; k++) {
        if ((lsb == slice->m_sps->m_ltRefPicPocLsbSps[k]) && (usedFlag == slice->m_sps->m_usedByCurrPicLtSPSFlag[k])) {
            *ltrpsIndex = k;
            return 1;
        }
    }

    return 0;
}